

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(RowGroup *a,RowGroup *b)

{
  long in_RSI;
  vector<duckdb_parquet::ColumnChunk,_true> *in_RDI;
  vector<duckdb_parquet::ColumnChunk,_true> *unaff_retaddr;
  
  std::swap<duckdb::vector<duckdb_parquet::ColumnChunk,true>>(unaff_retaddr,in_RDI);
  std::swap<long>((long *)&in_RDI[1].
                           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           .
                           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long *)(in_RSI + 0x20));
  std::swap<long>((long *)&in_RDI[1].
                           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           .
                           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (long *)(in_RSI + 0x28));
  std::swap<duckdb::vector<duckdb_parquet::SortingColumn,true>>
            ((vector<duckdb_parquet::SortingColumn,_true> *)unaff_retaddr,
             (vector<duckdb_parquet::SortingColumn,_true> *)in_RDI);
  std::swap<long>((long *)(in_RDI + 3),(long *)(in_RSI + 0x48));
  std::swap<long>((long *)&in_RDI[3].
                           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           .
                           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long *)(in_RSI + 0x50));
  std::swap<short>((short *)&in_RDI[3].
                             super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                             .
                             super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (short *)(in_RSI + 0x58));
  std::swap<duckdb_parquet::_RowGroup__isset>
            ((_RowGroup__isset *)
             ((long)&in_RDI[3].
                     super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                     .
                     super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
             (_RowGroup__isset *)(in_RSI + 0x5a));
  return;
}

Assistant:

void swap(RowGroup &a, RowGroup &b) {
  using ::std::swap;
  swap(a.columns, b.columns);
  swap(a.total_byte_size, b.total_byte_size);
  swap(a.num_rows, b.num_rows);
  swap(a.sorting_columns, b.sorting_columns);
  swap(a.file_offset, b.file_offset);
  swap(a.total_compressed_size, b.total_compressed_size);
  swap(a.ordinal, b.ordinal);
  swap(a.__isset, b.__isset);
}